

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BGIPSolution.cpp
# Opt level: O1

void __thiscall BGIPSolution::AddSolution(BGIPSolution *this,LIndex jpolIndex,double value)

{
  int *piVar1;
  sp_counted_base *psVar2;
  JointPolicyPureVector jp;
  I_PtPDpure_constPtr local_c8;
  JointPolicyPureVector local_b0;
  
  if (this->_m_pu == (Interface_ProblemToPolicyDiscretePure *)0x0) {
    psVar2 = (this->_m_puShared).pn.pi_;
    local_c8.px = (this->_m_puShared).px;
    local_c8.pn.pi_ = (this->_m_puShared).pn.pi_;
    if (psVar2 != (sp_counted_base *)0x0) {
      LOCK();
      piVar1 = &psVar2->use_count_;
      *piVar1 = *piVar1 + 1;
      UNLOCK();
    }
    JointPolicyPureVector::JointPolicyPureVector(&local_b0,&local_c8);
    boost::detail::shared_count::~shared_count(&local_c8.pn);
    JPolComponent_VectorImplementation::SetIndex
              (&local_b0.super_JPolComponent_VectorImplementation,jpolIndex);
    AddSolution(this,&local_b0,value);
  }
  else {
    JointPolicyPureVector::JointPolicyPureVector(&local_b0,this->_m_pu);
    JPolComponent_VectorImplementation::SetIndex
              (&local_b0.super_JPolComponent_VectorImplementation,jpolIndex);
    AddSolution(this,&local_b0,value);
  }
  JointPolicyPureVector::~JointPolicyPureVector(&local_b0);
  return;
}

Assistant:

void BGIPSolution::AddSolution(LIndex jpolIndex, double value)
{
    if(_m_pu)
    {
        JointPolicyPureVector jp=JointPolicyPureVector(_m_pu); 
        jp.SetIndex(jpolIndex);
        AddSolution(jp,value);
    }
    else
    {
        JointPolicyPureVector jp=JointPolicyPureVector(_m_puShared);
        jp.SetIndex(jpolIndex);
        AddSolution(jp,value);
    }
}